

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AirLock.hpp
# Opt level: O2

optional<std::any> * __thiscall
gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>::try_unload
          (optional<std::any> *__return_storage_ptr__,
          AirLock<std::any,_std::mutex,_std::condition_variable> *this)

{
  mutex *__mutex;
  
  if (((this->loaded)._M_base._M_i & 1U) != 0) {
    __mutex = &this->door;
    std::mutex::lock(__mutex);
    if (((this->loaded)._M_base._M_i & 1U) != 0) {
      std::optional<std::any>::optional<std::any,_true>(__return_storage_ptr__,&this->data);
      (this->loaded)._M_base._M_i = false;
      std::condition_variable::notify_one();
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return __return_storage_ptr__;
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  (__return_storage_ptr__->super__Optional_base<std::any,_false,_false>)._M_payload.
  super__Optional_payload<std::any,_true,_false,_false>.super__Optional_payload_base<std::any>.
  _M_engaged = false;
  return __return_storage_ptr__;
}

Assistant:

std::optional<T> try_unload()
    {
        if (loaded.load(std::memory_order_acquire)) {
            std::lock_guard<MUTEX> lock(door);
            // can use relaxed since we are behind a mutex
            if (loaded.load(std::memory_order_acquire)) {
                std::optional<T> val{std::move(data)};
                loaded.store(false, std::memory_order_release);
                condition.notify_one();
                return val;
            }
        }
        return std::nullopt;
    }